

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

int mg::fs::MappedFile::open(char *__file,int __oflag,...)

{
  int __fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_t __len;
  __off_t _Var1;
  void *pvVar2;
  undefined8 *puVar3;
  
  __fd = ::open(___oflag,0);
  if (__fd < 0) {
    __file[0] = '\0';
    __file[1] = '\0';
    __file[2] = '\0';
    __file[3] = '\0';
    __file[4] = '\0';
    __file[5] = '\0';
    __file[6] = '\0';
    __file[7] = '\0';
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00124c78;
    *(int *)&this[1]._vptr__Sp_counted_base = __fd;
    this[1]._M_use_count = 0;
    this[1]._M_weak_count = 0;
    puVar3 = (undefined8 *)0x0;
    __len = lseek(__fd,0,2);
    if (-1 < (long)__len) {
      puVar3 = (undefined8 *)0x0;
      _Var1 = lseek(__fd,0,0);
      if (-1 < _Var1) {
        puVar3 = (undefined8 *)0x0;
        pvVar2 = mmap((void *)0x0,__len,1,2,__fd,0);
        if (pvVar2 != (void *)0x0) {
          puVar3 = (undefined8 *)operator_new(0x10);
          *puVar3 = pvVar2;
          puVar3[1] = __len;
        }
      }
    }
    *(undefined8 **)__file = puVar3;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return (int)__file;
}

Assistant:

std::unique_ptr<MappedFile> MappedFile::open(const char *filename) {
  int file_fd = ::open(filename, O_RDONLY);
  if (file_fd < 0) {
    return nullptr;
  }

  std::shared_ptr<void> _defer_close_fd(nullptr,
                                        [=](...) { ::close(file_fd); });

  const off_t file_size = ::lseek(file_fd, 0, SEEK_END);
  if (file_size < 0) {
    return nullptr;
  }
  if (lseek(file_fd, 0, SEEK_SET) < 0) {
    return nullptr;
  }

  void *mmapped_data =
      mmap(nullptr, file_size, PROT_READ, MAP_PRIVATE, file_fd, 0);

  if (mmapped_data == nullptr) {
    return nullptr;
  }

  return std::unique_ptr<MappedFile>(
      new MappedFile(reinterpret_cast<uint8_t *>(mmapped_data), file_size));
}